

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_resetCStream_internal
                 (ZSTD_CStream *cctx,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  ZSTD_compressionParameters local_4c;
  
  ZSTD_getCParamsFromCCtxParams(&local_4c,&params,pledgedSrcSize,dictSize);
  params.cParams.targetLength = local_4c.targetLength;
  params.cParams.strategy = local_4c.strategy;
  params.cParams.windowLog = local_4c.windowLog;
  params.cParams.chainLog = local_4c.chainLog;
  if ((((0xffffffe9 < params.cParams.windowLog - 0x20) &&
       (0xffffffe6 < params.cParams.chainLog - 0x1f)) && (0xffffffe6 < local_4c.hashLog - 0x1f)) &&
     (((0xffffffe1 < local_4c.searchLog - 0x1f && (local_4c.minMatch - 3 < 5)) &&
      ((params.cParams.targetLength < 0x20001 && (params.cParams.strategy - ZSTD_fast < 9)))))) {
    if (cdict == (ZSTD_CDict *)0x0 || dict == (void *)0x0) {
      sVar1 = ZSTD_compressBegin_internal
                        (cctx,dict,dictSize,dictContentType,ZSTD_dtlm_fast,cdict,&params,
                         pledgedSrcSize,ZSTDb_buffered);
      if (sVar1 < 0xffffffffffffff89) {
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        cctx->inBuffTarget = (ulong)(cctx->blockSize == pledgedSrcSize) + cctx->blockSize;
        cctx->outBuffContentSize = 0;
        cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
        sVar1 = 0;
      }
      return sVar1;
    }
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3868,
                  "size_t ZSTD_resetCStream_internal(ZSTD_CStream *, const void *const, const size_t, const ZSTD_dictContentType_e, const ZSTD_CDict *const, ZSTD_CCtx_params, const unsigned long long)"
                 );
  }
  __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x3867,
                "size_t ZSTD_resetCStream_internal(ZSTD_CStream *, const void *const, const size_t, const ZSTD_dictContentType_e, const ZSTD_CDict *const, ZSTD_CCtx_params, const unsigned long long)"
               );
}

Assistant:

static size_t ZSTD_resetCStream_internal(ZSTD_CStream* cctx,
                    const void* const dict, size_t const dictSize, ZSTD_dictContentType_e const dictContentType,
                    const ZSTD_CDict* const cdict,
                    ZSTD_CCtx_params params, unsigned long long const pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_resetCStream_internal");
    /* Finalize the compression parameters */
    params.cParams = ZSTD_getCParamsFromCCtxParams(&params, pledgedSrcSize, dictSize);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                                         dict, dictSize, dictContentType, ZSTD_dtlm_fast,
                                         cdict,
                                         &params, pledgedSrcSize,
                                         ZSTDb_buffered) );

    cctx->inToCompress = 0;
    cctx->inBuffPos = 0;
    cctx->inBuffTarget = cctx->blockSize
                      + (cctx->blockSize == pledgedSrcSize);   /* for small input: avoid automatic flush on reaching end of block, since it would require to add a 3-bytes null block to end frame */
    cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
    cctx->streamStage = zcss_load;
    cctx->frameEnded = 0;
    return 0;   /* ready to go */
}